

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O0

void DispatchAlphaToGreen_C
               (uint8_t *alpha,int alpha_stride,int width,int height,uint32_t *dst,int dst_stride)

{
  int j;
  int i;
  int dst_stride_local;
  uint32_t *dst_local;
  int height_local;
  int width_local;
  int alpha_stride_local;
  uint8_t *alpha_local;
  
  dst_local = dst;
  alpha_local = alpha;
  for (j = 0; j < height; j = j + 1) {
    for (i = 0; i < width; i = i + 1) {
      dst_local[i] = (uint)alpha_local[i] << 8;
    }
    alpha_local = alpha_local + alpha_stride;
    dst_local = dst_local + dst_stride;
  }
  return;
}

Assistant:

static void DispatchAlphaToGreen_C(const uint8_t* WEBP_RESTRICT alpha,
                                   int alpha_stride, int width, int height,
                                   uint32_t* WEBP_RESTRICT dst,
                                   int dst_stride) {
  int i, j;
  for (j = 0; j < height; ++j) {
    for (i = 0; i < width; ++i) {
      dst[i] = alpha[i] << 8;  // leave A/R/B channels zero'd.
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }
}